

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O0

value * __thiscall
mjs::anon_unknown_35::escape
          (value *__return_storage_ptr__,anon_unknown_35 *this,
          gc_heap_ptr<mjs::global_object> *global,wstring_view s)

{
  bool bVar1;
  gc_heap *h;
  wstring_view local_98;
  string local_88 [2];
  undefined2 local_62;
  const_iterator pvStack_60;
  uint16_t ch;
  const_iterator __end2;
  const_iterator __begin2;
  wstring_view *__range2;
  wstring res;
  gc_heap_ptr<mjs::global_object> *global_local;
  wstring_view s_local;
  
  s_local._M_len = s._M_len;
  res.field_2._8_8_ = this;
  global_local = global;
  s_local._M_str = (wchar_t *)__return_storage_ptr__;
  std::__cxx11::wstring::wstring((wstring *)&__range2);
  __begin2 = (const_iterator)&global_local;
  __end2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::begin
                     ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)__begin2);
  pvStack_60 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::end
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)__begin2);
  for (; __end2 != pvStack_60; __end2 = __end2 + 1) {
    local_62 = (ushort)*__end2;
    bVar1 = anon_unknown_15::is_alpha_or_digit((uint)local_62);
    if ((bVar1) ||
       (bVar1 = (anonymous_namespace)::(anonymous_namespace)::is_in_list<char_const,8ul>
                          ((uint)local_62,(char (*) [8])"@*_+-./"), bVar1)) {
      std::__cxx11::wstring::push_back((wchar_t)&__range2);
    }
    else if (local_62 < 0x100) {
      anon_unknown_15::put_percent_hex_byte((wstring *)&__range2,(uint)local_62);
    }
    else {
      std::__cxx11::wstring::push_back((wchar_t)&__range2);
      std::__cxx11::wstring::push_back((wchar_t)&__range2);
      anon_unknown_15::put_hex_byte((wstring *)&__range2,(uint)local_62._1_1_);
      anon_unknown_15::put_hex_byte((wstring *)&__range2,(uint)local_62);
    }
  }
  h = gc_heap_ptr_untyped::heap((gc_heap_ptr_untyped *)res.field_2._8_8_);
  local_98 = (wstring_view)
             std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)&__range2);
  string::string(local_88,h,&local_98);
  value::value(__return_storage_ptr__,local_88);
  string::~string(local_88);
  std::__cxx11::wstring::~wstring((wstring *)&__range2);
  return __return_storage_ptr__;
}

Assistant:

value escape(const gc_heap_ptr<global_object>& global, const std::wstring_view s) {
    std::wstring res;
    for (uint16_t ch: s) {
        if (is_alpha_or_digit(ch) || is_in_list(ch, "@*_+-./")) {
            res.push_back(ch);
        } else if (ch > 255) {
            res.push_back('%');
            res.push_back('u');
            put_hex_byte(res, ch>>8);
            put_hex_byte(res, ch);
        } else {
            put_percent_hex_byte(res, ch);
        }
    }
    return value{string{global.heap(), res}};
}